

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

uint get_elf_hwcap(uint type)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  undefined8 in_RAX;
  FILE *__stream;
  size_t sVar3;
  bool bVar4;
  anon_struct_8_2_05f151bc entry;
  undefined8 local_28;
  
  local_28 = in_RAX;
  __stream = fopen("/proc/self/auxv","rb");
  if (__stream == (FILE *)0x0) {
    get_elf_hwcap();
    uVar2 = extraout_EAX;
  }
  else {
    do {
      iVar1 = feof(__stream);
      if (iVar1 != 0) break;
      sVar3 = fread(&local_28,8,1,__stream);
      if ((int)sVar3 == 1) {
        if ((uint)local_28 == 0 && local_28._4_4_ == 0) goto LAB_0013e174;
        bVar4 = (uint)local_28 != type;
      }
      else {
LAB_0013e174:
        bVar4 = false;
      }
    } while (bVar4);
    uVar2 = fclose(__stream);
  }
  return uVar2;
}

Assistant:

static unsigned int get_elf_hwcap(unsigned int type)
{
    unsigned int hwcap = 0;

#if defined __ANDROID__ || defined __OHOS__
    hwcap = get_elf_hwcap_from_getauxval(type);
#endif

    if (!hwcap)
        hwcap = get_elf_hwcap_from_proc_self_auxv(type);

#if defined __ANDROID__
#if __aarch64__
    if (type == AT_HWCAP)
    {
        // samsung exynos9810 on android pre-9 incorrectly reports armv8.2
        // for little cores, but big cores only support armv8.0
        // drop all armv8.2 features used by ncnn for preventing SIGILLs
        // ref https://reviews.llvm.org/D114523
        char arch[PROP_VALUE_MAX];
        int len = __system_property_get("ro.arch", arch);
        if (len > 0 && strncmp(arch, "exynos9810", 10) == 0)
        {
            hwcap &= ~HWCAP_ASIMDHP;
            hwcap &= ~HWCAP_ASIMDDP;
        }
    }
#endif // __aarch64__
#endif // defined __ANDROID__

    return hwcap;
}